

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

char * __thiscall Messages::Person::_InternalParse(Person *this,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  uint64 uVar2;
  string *psVar3;
  Person_PhoneNumber *msg;
  Container<google::protobuf::UnknownFieldSet> *pCVar4;
  ulong uVar5;
  string *str_1;
  string *str;
  Arena *pAStack_60;
  uint32 tag;
  Arena *arena;
  ParseContext *pPStack_50;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  Person *this_local;
  Person *local_30;
  undefined1 *local_28;
  UnknownFieldSet *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  this_local = (Person *)((long)&arena + 4);
  pPStack_50 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  local_30 = this_local;
  memset(this_local,0,4);
  pAStack_60 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
LAB_0010fb8c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_50,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0010fe78;
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag((char *)ctx_local,(uint32 *)((long)&str + 4),0);
    if (ctx_local == (ParseContext *)0x0) goto LAB_0010fe96;
    switch(str._4_4_ >> 3) {
    case 1:
      if ((str._4_4_ & 0xff) != 10) break;
      psVar3 = _internal_mutable_name_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            ((string *)psVar3,(char *)ctx_local,pPStack_50);
      google::protobuf::internal::VerifyUTF8(psVar3,"Messages.Person.name");
      goto joined_r0x0010fd07;
    case 2:
      if ((str._4_4_ & 0xff) == 0x10) {
        _Internal::set_has_id((HasBits *)((long)&arena + 4));
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->id_ = (int32)uVar2;
        goto joined_r0x0010fd07;
      }
      break;
    case 3:
      if ((str._4_4_ & 0xff) == 0x1a) {
        psVar3 = _internal_mutable_email_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              ((string *)psVar3,(char *)ctx_local,pPStack_50);
        google::protobuf::internal::VerifyUTF8(psVar3,"Messages.Person.email");
        goto joined_r0x0010fd07;
      }
      break;
    case 4:
      if ((str._4_4_ & 0xff) == 0x22) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.factory + 7);
        do {
          this_00 = pPStack_50;
          ctx_local = (ParseContext *)&ctx_local->field_0x1;
          msg = _internal_add_phones(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::
                      ParseMessage<Messages::Person_PhoneNumber>(this_00,msg,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) goto LAB_0010fe96;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_50->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) &&
                (bVar1 = google::protobuf::internal::ExpectTag<34u>((char *)ctx_local), bVar1));
        goto LAB_0010fb8c;
      }
    }
    if (((str._4_4_ & 7) == 4) || (str._4_4_ == 0)) {
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_50->super_EpsCopyInputStream,str._4_4_);
      goto LAB_0010fe78;
    }
    uVar5 = (ulong)str._4_4_;
    local_28 = &this->field_0x8;
    local_18 = local_28;
    local_10 = local_28;
    if (((uint)*(undefined8 *)local_28 & 1) == 1) {
      pCVar4 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)local_28);
      local_20 = &pCVar4->unknown_fields;
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)local_28);
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (uVar5,local_20,(char *)ctx_local,pPStack_50);
joined_r0x0010fd07:
    if (ctx_local == (ParseContext *)0x0) {
LAB_0010fe96:
      ctx_local = (ParseContext *)0x0;
LAB_0010fe78:
      google::protobuf::internal::HasBits<1UL>::Or
                (&this->_has_bits_,(HasBits<1UL> *)((long)&arena + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* Person::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required int32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string email = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_email();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.email");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .Messages.Person.PhoneNumber phones = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_phones(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}